

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_aialgorithm.cpp
# Opt level: O0

void __thiscall
Test_aialgorithm_fillZero_Test::~Test_aialgorithm_fillZero_Test
          (Test_aialgorithm_fillZero_Test *this)

{
  Test_aialgorithm_fillZero_Test *this_local;
  
  ~Test_aialgorithm_fillZero_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST_F(Test_aialgorithm, fillZero)
{
    // one
    {
        char buf1[1];
        std::memset(&buf1, 65, sizeof buf1);
        ai::fillZero(buf1);
        ASSERT_EQ(buf1[0], '\0');
    }

    // many
    {
        int        buf[132];
        const auto size2 = ai::countOf(buf);
        std::memset(&buf, 65, size2 * sizeof(int));
        ai::fillZero(buf);
        for (size_t i = 0; i < size2; i++)
        {
            ASSERT_EQ(buf[i], 0);
        }
    }
}